

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_init.c
# Opt level: O2

void lj_init_cpuflags(void)

{
  int iVar1;
  uint32_t features [4];
  uint32_t vendor [4];
  uint32_t xfeatures [4];
  
  iVar1 = lj_vm_cpuid(0,vendor);
  if (iVar1 != 0) {
    iVar1 = lj_vm_cpuid(1,features);
    if (iVar1 != 0) {
      if (6 < vendor[0]) {
        lj_vm_cpuid(7,xfeatures);
      }
      if ((features[2] >> 0x14 & 1) != 0) {
        str_hash_init_sse42();
      }
    }
  }
  return;
}

Assistant:

LJ_INITIALIZER(lj_init_cpuflags)
{
  uint32_t flags = 0;
#if LJ_TARGET_X86ORX64

  uint32_t vendor[4];
  uint32_t features[4];
  if (lj_vm_cpuid(0, vendor) && lj_vm_cpuid(1, features)) {
    flags |= ((features[2] >> 0)&1) * JIT_F_SSE3;
    flags |= ((features[2] >> 19)&1) * JIT_F_SSE4_1;
    flags |= ((features[2] >> 20)&1) * JIT_F_SSE4_2;
    if (vendor[0] >= 7) {
      uint32_t xfeatures[4];
      lj_vm_cpuid(7, xfeatures);
      flags |= ((xfeatures[1] >> 8)&1) * JIT_F_BMI2;
    }
  }

#endif

  /* The reason why we initialized early: select our string hash functions.  */
  str_hash_init (flags);
}